

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.hpp
# Opt level: O0

void __thiscall license::License::~License(License *this)

{
  License *this_local;
  
  ~License(this);
  operator_delete(this);
  return;
}

Assistant:

inline virtual ~License() {}